

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

void __thiscall rengine::OpenGLRenderer::TexturePool::compact(TexturePool *this)

{
  pointer puVar1;
  pointer puVar2;
  
  glFlush();
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    glBindTexture(0xde1,*puVar2);
    glTexImage2D(0xde1,0,0x1908,0,0,0,0x1908,0x1401,0);
  }
  return;
}

Assistant:

void compact() {
            glFlush();
            for (auto id : *this) {
                glBindTexture(GL_TEXTURE_2D, id);
                glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
            }
        }